

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O3

iterator * __thiscall
HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(iterator *this)

{
  double **ppdVar1;
  int iVar2;
  iterator __position;
  pointer piVar3;
  int iVar4;
  HighsInt *pHVar5;
  
  iVar2 = this->currentNode;
  pHVar5 = this->nodeLeft;
  iVar4 = this->nodeRight[iVar2];
  if (pHVar5[iVar2] == -1) {
    if (iVar4 == -1) {
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar4 = piVar3[-1];
      this->currentNode = iVar4;
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar3 + -1;
      goto LAB_0031f80b;
    }
  }
  else {
    if (iVar4 != -1) {
      __position._M_current =
           (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->stack,__position,
                   this->nodeRight + iVar2);
        pHVar5 = this->nodeLeft;
      }
      else {
        *__position._M_current = iVar4;
        (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    iVar4 = pHVar5[this->currentNode];
  }
  this->currentNode = iVar4;
LAB_0031f80b:
  (this->pos_).index_ = (this->pos_).index_ + (iVar4 - iVar2);
  ppdVar1 = &(this->pos_).value_;
  *ppdVar1 = *ppdVar1 + (iVar4 - iVar2);
  return this;
}

Assistant:

iterator& operator++() {
      HighsInt offset = -currentNode;
      if (nodeLeft[currentNode] != -1) {
        if (nodeRight[currentNode] != -1)
          stack.push_back(nodeRight[currentNode]);
        currentNode = nodeLeft[currentNode];
      } else if (nodeRight[currentNode] != -1) {
        currentNode = nodeRight[currentNode];
      } else {
        currentNode = stack.back();
        stack.pop_back();
      }
      offset += currentNode;
      pos_.index_ += offset;
      pos_.value_ += offset;
      return *this;
    }